

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O1

void CreateFAPOBaseWithCustomAllocatorEXT
               (FAPOBase *fapo,FAPORegistrationProperties *pRegistrationProperties,
               uint8_t *pParameterBlocks,uint32_t uParameterBlockByteSize,uint8_t fProducer,
               FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
               FAudioReallocFunc customRealloc)

{
  (fapo->base).AddRef = FAPOBase_AddRef;
  (fapo->base).Release = FAPOBase_Release;
  (fapo->base).GetRegistrationProperties = FAPOBase_GetRegistrationProperties;
  (fapo->base).IsInputFormatSupported = FAPOBase_IsInputFormatSupported;
  (fapo->base).IsOutputFormatSupported = FAPOBase_IsOutputFormatSupported;
  (fapo->base).Initialize = FAPOBase_Initialize;
  (fapo->base).Reset = FAPOBase_Reset;
  (fapo->base).LockForProcess = FAPOBase_LockForProcess;
  (fapo->base).UnlockForProcess = FAPOBase_UnlockForProcess;
  (fapo->base).CalcInputFrames = FAPOBase_CalcInputFrames;
  (fapo->base).CalcOutputFrames = FAPOBase_CalcOutputFrames;
  (fapo->base).SetParameters = FAPOBase_SetParameters;
  (fapo->base).GetParameters = FAPOBase_GetParameters;
  fapo->OnSetParameters = FAPOBase_OnSetParameters;
  fapo->m_pRegistrationProperties = pRegistrationProperties;
  fapo->m_pfnMatrixMixFunction = (void *)0x0;
  fapo->m_pfl32MatrixCoefficients = (float *)0x0;
  *(undefined8 *)((long)&fapo->m_pfl32MatrixCoefficients + 6) = 0;
  fapo->m_pParameterBlocks = pParameterBlocks;
  fapo->m_pCurrentParameters = pParameterBlocks;
  fapo->m_pCurrentParametersInternal = pParameterBlocks;
  fapo->m_uCurrentParametersIndex = 0;
  fapo->m_uParameterBlockByteSize = uParameterBlockByteSize;
  fapo->m_fNewerResultsReady = '\0';
  fapo->m_fProducer = fProducer;
  fapo->pMalloc = customMalloc;
  fapo->pFree = customFree;
  fapo->pRealloc = customRealloc;
  fapo->m_lReferenceCount = 1;
  return;
}

Assistant:

void CreateFAPOBaseWithCustomAllocatorEXT(
	FAPOBase *fapo,
	const FAPORegistrationProperties *pRegistrationProperties,
	uint8_t *pParameterBlocks,
	uint32_t uParameterBlockByteSize,
	uint8_t fProducer,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	/* Base Classes/Interfaces */
	#define ASSIGN_VT(name) \
		fapo->base.name = (name##Func) FAPOBase_##name;
	ASSIGN_VT(AddRef)
	ASSIGN_VT(Release)
	ASSIGN_VT(GetRegistrationProperties)
	ASSIGN_VT(IsInputFormatSupported)
	ASSIGN_VT(IsOutputFormatSupported)
	ASSIGN_VT(Initialize)
	ASSIGN_VT(Reset)
	ASSIGN_VT(LockForProcess)
	ASSIGN_VT(UnlockForProcess)
	ASSIGN_VT(CalcInputFrames)
	ASSIGN_VT(CalcOutputFrames)
	ASSIGN_VT(SetParameters)
	ASSIGN_VT(GetParameters)
	#undef ASSIGN_VT

	/* Public Virtual Functions */
	fapo->OnSetParameters = (OnSetParametersFunc)
		FAPOBase_OnSetParameters;

	/* Private Variables */
	fapo->m_pRegistrationProperties = pRegistrationProperties; /* FIXME */
	fapo->m_pfnMatrixMixFunction = NULL; /* FIXME */
	fapo->m_pfl32MatrixCoefficients = NULL; /* FIXME */
	fapo->m_nSrcFormatType = 0; /* FIXME */
	fapo->m_fIsScalarMatrix = 0; /* FIXME: */
	fapo->m_fIsLocked = 0;
	fapo->m_pParameterBlocks = pParameterBlocks;
	fapo->m_pCurrentParameters = pParameterBlocks;
	fapo->m_pCurrentParametersInternal = pParameterBlocks;
	fapo->m_uCurrentParametersIndex = 0;
	fapo->m_uParameterBlockByteSize = uParameterBlockByteSize;
	fapo->m_fNewerResultsReady = 0;
	fapo->m_fProducer = fProducer;

	/* Allocator Callbacks */
	fapo->pMalloc = customMalloc;
	fapo->pFree = customFree;
	fapo->pRealloc = customRealloc;

	/* Protected Variables */
	fapo->m_lReferenceCount = 1;
}